

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::createSlicePlaneFliterRule
          (MockGLEngine *this,string *uniquePostfix)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  *this_00;
  undefined1 uVar1;
  string *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_false,_true>,_bool>
  pVar2;
  string *in_stack_000000b8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  value_type *in_stack_fffffffffffffcc8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd09;
  string local_2f0 [160];
  string local_250 [192];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_true>
  local_190;
  undefined1 local_188;
  string local_170 [160];
  string local_d0 [184];
  string *in_stack_ffffffffffffffe8;
  
  std::operator+((char *)CONCAT71(in_stack_fffffffffffffd09,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
  std::__cxx11::string::string(local_170,in_RSI);
  backend_openGL3_glfw::generateSlicePlaneRule(in_stack_000000b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_true>
            (in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->first,
             (ShaderReplacementRule *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0))
  ;
  pVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                    *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_190._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_true>
       ._M_cur;
  local_188 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
           *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  ShaderReplacementRule::~ShaderReplacementRule
            ((ShaderReplacementRule *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0))
  ;
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_d0);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
             *)(in_RDI + 0x318);
  std::operator+((char *)CONCAT71(in_stack_fffffffffffffd09,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
  std::__cxx11::string::string(local_2f0,in_RSI);
  backend_openGL3_glfw::generateVolumeGridSlicePlaneRule(in_stack_ffffffffffffffe8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_true>
            (this_00,&in_stack_fffffffffffffcc8->first,
             (ShaderReplacementRule *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0))
  ;
  pVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
          ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                    *)this_00,in_stack_fffffffffffffcc8);
  uVar1 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
           *)CONCAT17(uVar1,in_stack_fffffffffffffcc0));
  ShaderReplacementRule::~ShaderReplacementRule
            ((ShaderReplacementRule *)CONCAT17(uVar1,in_stack_fffffffffffffcc0));
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_250);
  return;
}

Assistant:

void MockGLEngine::createSlicePlaneFliterRule(std::string uniquePostfix) {
  using namespace backend_openGL3_glfw;
  registeredShaderRules.insert({"SLICE_PLANE_CULL_" + uniquePostfix, generateSlicePlaneRule(uniquePostfix)});
  registeredShaderRules.insert(
      {"SLICE_PLANE_VOLUMEGRID_CULL_" + uniquePostfix, generateVolumeGridSlicePlaneRule(uniquePostfix)});
}